

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger array_find(HSQUIRRELVM v)

{
  SQOuter *this;
  bool bVar1;
  SQObjectPtr *pSVar2;
  SQObjectPtr *o2;
  SQTable *pSVar3;
  SQObjectValue nidx;
  bool res;
  HSQUIRRELVM local_60;
  SQTable *local_58;
  SQObjectPtr local_50;
  SQObjectPtr temp;
  
  pSVar2 = stack_get(v,1);
  local_60 = v;
  o2 = stack_get(v,2);
  this = (pSVar2->super_SQObject)._unVal.pOuter;
  local_58 = (SQTable *)this->_idx;
  temp.super_SQObject._type = OT_NULL;
  temp.super_SQObject._unVal.pTable = (SQTable *)0x0;
  nidx.pTable = (SQTable *)0x0;
  pSVar3 = (SQTable *)0x0;
  if (0 < (long)local_58) {
    pSVar3 = local_58;
  }
  do {
    if (pSVar3 == nidx.pTable) {
LAB_00118280:
      bVar1 = nidx.nInteger < (long)local_58;
      SQObjectPtr::~SQObjectPtr(&temp);
      return (ulong)bVar1;
    }
    res = false;
    SQArray::Get((SQArray *)this,nidx.nInteger,&temp);
    bVar1 = SQVM::IsEqual(&temp,o2,&res);
    if ((bVar1) && (res == true)) {
      local_50.super_SQObject._type = OT_INTEGER;
      local_50.super_SQObject._unVal = nidx;
      SQVM::Push(local_60,&local_50);
      SQObjectPtr::~SQObjectPtr(&local_50);
      goto LAB_00118280;
    }
    nidx.pTable = (SQTable *)
                  ((long)&((nidx.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                          _vptr_SQRefCounted + 1);
  } while( true );
}

Assistant:

static SQInteger array_find(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v,1);
    SQObjectPtr &val = stack_get(v,2);
    SQArray *a = _array(o);
    SQInteger size = a->Size();
    SQObjectPtr temp;
    for(SQInteger n = 0; n < size; n++) {
        bool res = false;
        a->Get(n,temp);
        if(SQVM::IsEqual(temp,val,res) && res) {
            v->Push(n);
            return 1;
        }
    }
    return 0;
}